

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::BuilderArena::LocalCapTable::dropCap(LocalCapTable *this,uint index)

{
  size_t sVar1;
  Maybe<kj::Own<capnp::ClientHook>_> *this_00;
  Maybe<kj::Own<capnp::ClientHook>_> local_40 [2];
  Fault local_20;
  Fault f;
  uint index_local;
  LocalCapTable *this_local;
  
  f.exception._4_4_ = index;
  sVar1 = kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::size(&this->capTable);
  if (index < sVar1) {
    kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe(local_40,(void *)0x0);
    this_00 = kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator[]
                        (&this->capTable,(ulong)f.exception._4_4_);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::operator=(this_00,local_40);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe(local_40);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
               ,0x14a,FAILED,"index < capTable.size()",
               "\"Invalid capability descriptor in message.\"",
               (char (*) [42])"Invalid capability descriptor in message.");
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return;
}

Assistant:

void BuilderArena::LocalCapTable::dropCap(uint index) {
  KJ_ASSERT(index < capTable.size(), "Invalid capability descriptor in message.") {
    return;
  }
  capTable[index] = nullptr;
}